

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O1

void remove_range_closed_at(art_t *art,uint8_t *high48,uint16_t min,uint16_t max)

{
  rle16_t *prVar1;
  byte bVar2;
  bool bVar3;
  art_val_t *__ptr;
  array_container_t *run;
  byte bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ushort uVar10;
  uint8_t *puVar11;
  ulong uVar12;
  uint uVar13;
  art_t *paVar14;
  art_t *paVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  uint8_t typecode2;
  uint8_t local_51;
  ulong local_50;
  uint8_t *local_48;
  ulong local_40;
  art_t *local_38;
  
  puVar11 = high48;
  paVar14 = art;
  __ptr = art_find(art,high48);
  if (__ptr == (art_val_t *)0x0) {
    return;
  }
  run = *(array_container_t **)(__ptr[1].key + 2);
  local_38 = art;
  if (__ptr[1].key[0] == '\x03') {
    iVar5 = run->cardinality;
    lVar20 = (long)iVar5;
    if ((lVar20 != 0) &&
       ((prVar1 = (rle16_t *)run->array, prVar1->value < min ||
        (max < (ushort)(prVar1[lVar20 + -1].length + prVar1[lVar20 + -1].value))))) {
      iVar8 = iVar5 + -1;
      uVar13 = 0;
      puVar11 = high48;
      iVar19 = iVar8;
      do {
        if (iVar19 < (int)uVar13) {
          uVar13 = ~uVar13;
          puVar11 = (uint8_t *)(ulong)uVar13;
          break;
        }
        uVar17 = uVar13 + iVar19 >> 1;
        if ((ushort)(prVar1[uVar17].length + prVar1[uVar17].value) < min) {
          uVar13 = uVar17 + 1;
          bVar3 = true;
        }
        else if (min < prVar1[uVar17].value) {
          iVar19 = uVar17 - 1;
          bVar3 = true;
        }
        else {
          bVar3 = false;
          puVar11 = (uint8_t *)(ulong)uVar17;
        }
      } while (bVar3);
      uVar6 = (uint)puVar11;
      uVar17 = 0;
      do {
        if (iVar8 < (int)uVar17) {
          uVar13 = ~uVar17;
          break;
        }
        uVar16 = uVar17 + iVar8 >> 1;
        if ((ushort)(prVar1[uVar16].length + prVar1[uVar16].value) < max) {
          uVar17 = uVar16 + 1;
          bVar3 = true;
        }
        else if (max < prVar1[uVar16].value) {
          iVar8 = uVar16 - 1;
          bVar3 = true;
        }
        else {
          bVar3 = false;
          uVar13 = uVar16;
        }
      } while (bVar3);
      if ((int)uVar6 < 0) {
        uVar6 = ~uVar6;
LAB_0010ae85:
        if ((int)uVar13 < 0) {
          uVar13 = -uVar13 - 2;
        }
        else {
          uVar10 = prVar1[uVar13].length + prVar1[uVar13].value;
          if (max < uVar10) {
            prVar1[uVar13].value = max + 1;
            prVar1[uVar13].length = uVar10 - (max + 1);
            uVar13 = uVar13 - 1;
          }
        }
        local_48 = high48;
        if ((int)uVar6 <= (int)uVar13) {
          iVar5 = iVar5 + ~uVar13;
          iVar19 = uVar6 + ~uVar13;
          if ((0 < iVar19) && (run->capacity < iVar5 + iVar19)) {
            run_container_grow((run_container_t *)run,iVar5 + iVar19,true);
          }
          lVar20 = (long)run->cardinality - (long)iVar5;
          memmove((rle16_t *)run->array + ((int)lVar20 + iVar19),(rle16_t *)run->array + lVar20,
                  (long)iVar5 << 2);
          run->cardinality = run->cardinality + iVar19;
        }
      }
      else {
        uVar7 = (ulong)puVar11 & 0xffffffff;
        uVar10 = prVar1[uVar7].value;
        if (min <= uVar10) goto LAB_0010ae85;
        if ((uint)prVar1[uVar7].length + (uint)uVar10 <= (uint)max) {
          prVar1[uVar7].length = min + ~uVar10;
          uVar6 = uVar6 + 1;
          goto LAB_0010ae85;
        }
        local_50 = uVar7;
        local_48 = high48;
        if (run->capacity <= iVar5) {
          run_container_grow((run_container_t *)run,iVar5 + 1,true);
        }
        uVar7 = (long)(int)uVar6 + 1U & 0xffff;
        memmove((rle16_t *)run->array + uVar7 + 1,(rle16_t *)run->array + uVar7,
                ((long)run->cardinality - uVar7) * 4);
        run->cardinality = run->cardinality + 1;
        prVar1 = (rle16_t *)run->array;
        uVar7 = (long)(int)uVar6 + 1U & 0xffffffff;
        prVar1[uVar7].value = max + 1;
        uVar10 = prVar1[local_50].value;
        prVar1[uVar7].length = ~max + uVar10 + prVar1[local_50].length;
        prVar1[local_50].length = min + ~uVar10;
      }
      run = (array_container_t *)
            convert_run_to_efficient_container((run_container_t *)run,&local_51);
      high48 = local_48;
      goto LAB_0010afe1;
    }
  }
  else if (__ptr[1].key[0] == '\x02') {
    prVar1 = (rle16_t *)run->array;
    uVar13 = run->cardinality;
    uVar6 = 0;
    uVar17 = 0;
    if (uVar13 != 0) {
      iVar5 = uVar13 - 1;
      uVar17 = 0;
      do {
        if (iVar5 < (int)uVar17) {
          uVar16 = ~uVar17;
          break;
        }
        uVar16 = uVar17 + iVar5 >> 1;
        uVar10 = *(ushort *)((long)&prVar1->value + (ulong)(uVar17 + iVar5 & 0xfffffffe));
        if (uVar10 < max) {
          uVar17 = uVar16 + 1;
          bVar3 = true;
        }
        else if (max < uVar10) {
          iVar5 = uVar16 - 1;
          bVar3 = true;
        }
        else {
          bVar3 = false;
          puVar11 = (uint8_t *)(ulong)uVar16;
        }
        uVar16 = (uint)puVar11;
      } while (bVar3);
      paVar14 = (art_t *)(ulong)~uVar16;
      uVar17 = uVar16 + 1;
      if (-1 < (int)uVar16) {
        uVar17 = ~uVar16;
      }
      uVar17 = uVar17 + uVar13;
    }
    if (uVar13 != uVar17) {
      iVar5 = ~uVar17 + uVar13;
      uVar16 = 0;
      do {
        if (iVar5 < (int)uVar16) {
          uVar6 = ~uVar16;
          break;
        }
        uVar6 = uVar16 + iVar5 >> 1;
        paVar15 = (art_t *)(ulong)uVar6;
        uVar10 = *(ushort *)((long)&prVar1->value + (ulong)(uVar16 + iVar5 & 0xfffffffe));
        if (uVar10 < min) {
          uVar16 = uVar6 + 1;
          bVar3 = true;
          paVar15 = paVar14;
        }
        else if (min < uVar10) {
          iVar5 = uVar6 - 1;
          bVar3 = true;
          paVar15 = paVar14;
        }
        else {
          bVar3 = false;
        }
        uVar6 = (uint)paVar15;
        paVar14 = paVar15;
      } while (bVar3);
      uVar6 = (int)uVar6 >> 0x1f ^ uVar6;
    }
    if (uVar6 + uVar17 != 0) {
      local_51 = '\x02';
      iVar5 = uVar13 - (uVar6 + uVar17);
      if (iVar5 != 0) {
        memmove(&prVar1->value + uVar6,&prVar1->value + (uVar6 + iVar5),(ulong)uVar17 * 2);
        run->cardinality = run->cardinality - iVar5;
      }
      goto LAB_0010afe1;
    }
  }
  else {
    prVar1 = (rle16_t *)run->array;
    uVar10 = min >> 6;
    uVar7 = (ulong)uVar10;
    uVar21 = (ulong)(max >> 6);
    uVar17 = (uint)(max >> 6);
    uVar13 = (uint)uVar10;
    bVar4 = (byte)min;
    bVar2 = (byte)max;
    if (uVar17 == uVar13) {
      uVar18 = *(ulong *)(prVar1 + uVar7 * 2) &
               (0xffffffffffffffffU >> (~bVar2 + bVar4 & 0x3f)) << (bVar4 & 0x3f);
      uVar18 = uVar18 - (uVar18 >> 1 & 0x5555555555555555);
      uVar18 = (uVar18 >> 2 & 0x3333333333333333) + (uVar18 & 0x3333333333333333);
      uVar6 = (uint)(byte)(((uVar18 >> 4) + uVar18 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)
      ;
    }
    else {
      local_50 = CONCAT44(local_50._4_4_,run->cardinality);
      uVar18 = (*(ulong *)(prVar1 + uVar7 * 2) >> (bVar4 & 0x3f)) << (bVar4 & 0x3f);
      uVar18 = uVar18 - (uVar18 >> 1 & 0x5555555555555555);
      uVar18 = (uVar18 >> 2 & 0x3333333333333333) + (uVar18 & 0x3333333333333333);
      uVar18 = ((uVar18 >> 4) + uVar18 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
      uVar12 = uVar18 >> 0x38;
      uVar6 = (uint)(byte)(uVar18 >> 0x38);
      if (uVar13 + 1 < uVar17) {
        uVar18 = (ulong)(uVar13 + 1);
        do {
          uVar9 = *(ulong *)(prVar1 + uVar18 * 2) -
                  (*(ulong *)(prVar1 + uVar18 * 2) >> 1 & 0x5555555555555555);
          uVar9 = (uVar9 >> 2 & 0x3333333333333333) + (uVar9 & 0x3333333333333333);
          uVar6 = (int)uVar12 +
                  (uint)(byte)(((uVar9 >> 4) + uVar9 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                              0x38);
          uVar12 = (ulong)uVar6;
          uVar18 = uVar18 + 1;
        } while (uVar21 != uVar18);
      }
      uVar18 = (ulong)(*(long *)(prVar1 + uVar21 * 2) << (~bVar2 & 0x3f)) >> (~bVar2 & 0x3f);
      uVar18 = uVar18 - (uVar18 >> 1 & 0x5555555555555555);
      uVar18 = (uVar18 >> 2 & 0x3333333333333333) + (uVar18 & 0x3333333333333333);
      uVar6 = (byte)(((uVar18 >> 4) + uVar18 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) +
              uVar6;
      local_48 = high48;
      local_40 = (ulong)max;
    }
    iVar5 = run->cardinality - uVar6;
    if (iVar5 != 0) {
      uVar6 = (uint)uVar10;
      if (iVar5 < 0x1001) {
        local_51 = '\x02';
        if (max + 1 != (uint)min) {
          uVar18 = -1L << (bVar4 & 0x3f);
          if (uVar17 - uVar6 == 0) {
            uVar18 = (uVar18 << (~bVar2 & 0x3f)) >> (~bVar2 & 0x3f);
            uVar21 = uVar7;
          }
          else {
            *(ulong *)(prVar1 + uVar7 * 2) = *(ulong *)(prVar1 + uVar7 * 2) & ~uVar18;
            if (uVar6 + 1 < uVar17) {
              local_50 = CONCAT44(local_50._4_4_,iVar5);
              memset(prVar1 + uVar7 * 2 + 2,0,(ulong)((uVar17 - uVar6) - 2) * 8 + 8);
              iVar5 = (int32_t)local_50;
            }
            uVar18 = 0xffffffffffffffff >> (~bVar2 & 0x3f);
          }
          *(ulong *)(prVar1 + uVar21 * 2) = *(ulong *)(prVar1 + uVar21 * 2) & ~uVar18;
        }
        run->cardinality = iVar5;
        run = array_container_from_bitset((bitset_container_t *)run);
      }
      else {
        local_51 = '\x01';
        if (max + 1 != (uint)min) {
          uVar18 = -1L << (bVar4 & 0x3f);
          if (uVar17 - uVar13 == 0) {
            uVar18 = (uVar18 << (~bVar2 & 0x3f)) >> (~bVar2 & 0x3f);
            uVar21 = uVar7;
          }
          else {
            *(ulong *)(prVar1 + uVar7 * 2) = *(ulong *)(prVar1 + uVar7 * 2) & ~uVar18;
            if (uVar6 + 1 < uVar17) {
              local_50 = CONCAT44(local_50._4_4_,iVar5);
              memset(prVar1 + uVar7 * 2 + 2,0,(ulong)((uVar17 - uVar13) - 2) * 8 + 8);
              iVar5 = (int32_t)local_50;
            }
            uVar18 = 0xffffffffffffffff >> (~bVar2 & 0x3f);
          }
          *(ulong *)(prVar1 + uVar21 * 2) = *(ulong *)(prVar1 + uVar21 * 2) & ~uVar18;
        }
        run->cardinality = iVar5;
      }
      goto LAB_0010afe1;
    }
  }
  run = (array_container_t *)0x0;
LAB_0010afe1:
  if (run != *(array_container_t **)(__ptr[1].key + 2)) {
    container_free(*(array_container_t **)(__ptr[1].key + 2),__ptr[1].key[0]);
    if (run == (array_container_t *)0x0) {
      art_erase(local_38,high48);
      roaring_free(__ptr);
    }
    else {
      *(array_container_t **)(__ptr[1].key + 2) = run;
      __ptr[1].key[0] = local_51;
    }
  }
  return;
}

Assistant:

static inline void remove_range_closed_at(art_t *art, uint8_t *high48,
                                          uint16_t min, uint16_t max) {
    leaf_t *leaf = (leaf_t *)art_find(art, high48);
    if (leaf == NULL) {
        return;
    }
    uint8_t typecode2;
    container_t *container2 = container_remove_range(
        leaf->container, leaf->typecode, min, max, &typecode2);
    if (container2 != leaf->container) {
        container_free(leaf->container, leaf->typecode);
        if (container2 != NULL) {
            leaf->container = container2;
            leaf->typecode = typecode2;
        } else {
            art_erase(art, high48);
            free_leaf(leaf);
        }
    }
}